

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O0

int run_test_barrier_serial_thread(void)

{
  int iVar1;
  uint local_4c;
  undefined1 local_48 [4];
  uint i;
  uv_barrier_t barrier;
  uv_thread_t threads [4];
  
  iVar1 = uv_barrier_init((uv_barrier_t *)local_48,5);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-barrier.c"
            ,0x7e,"0 == uv_barrier_init(&barrier, ARRAY_SIZE(threads) + 1)");
    abort();
  }
  local_4c = 0;
  while( true ) {
    if (3 < local_4c) {
      iVar1 = uv_barrier_wait((uv_barrier_t *)local_48);
      if (0 < iVar1) {
        uv_barrier_destroy((uv_barrier_t *)local_48);
      }
      local_4c = 0;
      while( true ) {
        if (3 < local_4c) {
          return 0;
        }
        iVar1 = uv_thread_join(threads + ((ulong)local_4c - 1));
        if (iVar1 != 0) break;
        local_4c = local_4c + 1;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-barrier.c"
              ,0x87,"0 == uv_thread_join(&threads[i])");
      abort();
    }
    iVar1 = uv_thread_create(threads + ((ulong)local_4c - 1),serial_worker,local_48);
    if (iVar1 != 0) break;
    local_4c = local_4c + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-barrier.c"
          ,0x81,"0 == uv_thread_create(&threads[i], serial_worker, &barrier)");
  abort();
}

Assistant:

TEST_IMPL(barrier_serial_thread) {
  uv_thread_t threads[4];
  uv_barrier_t barrier;
  unsigned i;

  ASSERT(0 == uv_barrier_init(&barrier, ARRAY_SIZE(threads) + 1));

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT(0 == uv_thread_create(&threads[i], serial_worker, &barrier));

  if (uv_barrier_wait(&barrier) > 0)
    uv_barrier_destroy(&barrier);

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT(0 == uv_thread_join(&threads[i]));

  return 0;
}